

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

int __thiscall duckdb_re2::DFA::BuildAllStates(DFA *this,DFAStateCallback *cb)

{
  byte bVar1;
  Prog *pPVar2;
  State *state;
  _Hash_node_base *p_Var3;
  State *pSVar4;
  long lVar5;
  long lVar6;
  pointer piVar7;
  bool bVar8;
  mapped_type *pmVar9;
  uint uVar10;
  __hash_code __code;
  size_type __n;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  State *ns;
  vector<int,_std::allocator<int>_> output;
  vector<int,_std::allocator<int>_> input;
  deque<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_> q;
  RWLocker l;
  unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
  m;
  State *local_170;
  undefined4 local_164;
  ulong local_160;
  vector<int,_std::allocator<int>_> local_158;
  vector<int,_std::allocator<int>_> local_140;
  _Deque_base<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_> local_128;
  DFAStateCallback *local_d8;
  RWLocker local_d0;
  _Hashtable<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_c0;
  SearchParams local_88;
  
  if (this->init_failed_ != false) {
    return 0;
  }
  RWLocker::RWLocker(&local_d0,&this->cache_mutex_);
  local_88.text.data_ = (const_pointer)0x0;
  local_88.text.size_ = 0;
  local_88.start = (State *)0x0;
  local_88.context.data_ = (const_pointer)0x0;
  local_88.context.size_ = 0;
  iVar14 = 0;
  local_88.failed = false;
  local_88.ep = (char *)0x0;
  local_88.matches = (SparseSet *)0x0;
  local_88.anchored = false;
  local_88.can_prefix_accel = false;
  local_88.want_earliest_match = false;
  local_88.run_forward = false;
  local_88.cache_lock = &local_d0;
  bVar8 = AnalyzeSearch(this,&local_88);
  if (bVar8 && (State *)0x1 < local_88.start) {
    local_c0._M_buckets = &local_c0._M_single_bucket;
    local_c0._M_bucket_count = 1;
    local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_c0._M_element_count = 0;
    local_c0._M_rehash_policy._M_max_load_factor = 1.0;
    local_c0._M_rehash_policy._M_next_resize = 0;
    local_c0._M_single_bucket = (__node_base_ptr)0x0;
    local_128._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_128._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_128._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_128._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_128._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_128._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_128._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_128._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_>::
    _M_initialize_map(&local_128,0);
    local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_4_ = (int)local_c0._M_element_count;
    std::
    _Hashtable<duckdb_re2::DFA::State*,std::pair<duckdb_re2::DFA::State*const,int>,std::allocator<std::pair<duckdb_re2::DFA::State*const,int>>,std::__detail::_Select1st,std::equal_to<duckdb_re2::DFA::State*>,std::hash<duckdb_re2::DFA::State*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<duckdb_re2::DFA::State*&,int>
              ((_Hashtable<duckdb_re2::DFA::State*,std::pair<duckdb_re2::DFA::State*const,int>,std::allocator<std::pair<duckdb_re2::DFA::State*const,int>>,std::__detail::_Select1st,std::equal_to<duckdb_re2::DFA::State*>,std::hash<duckdb_re2::DFA::State*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&local_c0,&local_88.start);
    if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_128._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<duckdb_re2::DFA::State*,std::allocator<duckdb_re2::DFA::State*>>::
      _M_push_back_aux<duckdb_re2::DFA::State*const&>
                ((deque<duckdb_re2::DFA::State*,std::allocator<duckdb_re2::DFA::State*>> *)
                 &local_128,&local_88.start);
    }
    else {
      *local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = local_88.start;
      local_128._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_128._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    __n = (long)this->prog_->bytemap_range_ + 1;
    std::vector<int,_std::allocator<int>_>::vector(&local_140,__n,(allocator_type *)&local_158);
    pPVar2 = this->prog_;
    lVar5 = CONCAT44(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._0_4_);
    lVar16 = 0;
    do {
      iVar15 = (int)lVar16;
      bVar1 = pPVar2->bytemap_[iVar15];
      iVar14 = iVar15 + -1;
      lVar12 = (long)iVar15;
      do {
        if (0xfe < lVar12) {
          *(undefined4 *)(lVar5 + (ulong)bVar1 * 4) = 0xff;
          *(undefined4 *)(lVar5 + (long)pPVar2->bytemap_range_ * 4) = 0x100;
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_158,__n,(allocator_type *)&local_170);
          if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_128._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00484f5d;
          uVar11 = 0;
          local_d8 = cb;
          goto LAB_00484d61;
        }
        lVar16 = lVar12 + 1;
        iVar14 = iVar14 + 1;
        lVar6 = lVar12 + 1;
        lVar12 = lVar16;
      } while (pPVar2->bytemap_[lVar6] == bVar1);
      *(int *)(lVar5 + (ulong)bVar1 * 4) = iVar14;
    } while( true );
  }
  goto LAB_00484f99;
LAB_00484d61:
  do {
    state = *local_128._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_160 = uVar11;
    if (local_128._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_128._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_128._M_impl.super__Deque_impl_data._M_start._M_first);
      local_128._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_128._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_128._M_impl.super__Deque_impl_data._M_start._M_last =
           local_128._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
      local_128._M_impl.super__Deque_impl_data._M_start._M_first =
           local_128._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_128._M_impl.super__Deque_impl_data._M_start._M_node =
           local_128._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_128._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_128._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    piVar7 = local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    for (piVar13 = (int *)CONCAT44(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_4_); uVar11 = local_160,
        piVar13 != piVar7; piVar13 = piVar13 + 1) {
      iVar14 = *piVar13;
      local_170 = RunStateOnByteUnlocked(this,state,iVar14);
      if (local_170 == (State *)0x1) {
        if (iVar14 == 0x100) {
          uVar10 = this->prog_->bytemap_range_;
        }
        else {
          uVar10 = (uint)this->prog_->bytemap_[iVar14];
        }
        local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)uVar10] = -1;
      }
      else {
        if (local_170 == (State *)0x0) {
          uVar11 = CONCAT71((uint7)(uint3)((uint)iVar14 >> 8),1);
          break;
        }
        if (local_c0._M_buckets[(ulong)local_170 % local_c0._M_bucket_count] != (__node_base_ptr)0x0
           ) {
          p_Var3 = local_c0._M_buckets[(ulong)local_170 % local_c0._M_bucket_count]->_M_nxt;
          pSVar4 = (State *)p_Var3[1]._M_nxt;
          do {
            if (local_170 == pSVar4) goto LAB_00484ec7;
            p_Var3 = p_Var3->_M_nxt;
          } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                  (pSVar4 = (State *)p_Var3[1]._M_nxt,
                  (ulong)pSVar4 % local_c0._M_bucket_count ==
                  (ulong)local_170 % local_c0._M_bucket_count));
        }
        local_164 = (int)local_c0._M_element_count;
        std::
        _Hashtable<duckdb_re2::DFA::State*,std::pair<duckdb_re2::DFA::State*const,int>,std::allocator<std::pair<duckdb_re2::DFA::State*const,int>>,std::__detail::_Select1st,std::equal_to<duckdb_re2::DFA::State*>,std::hash<duckdb_re2::DFA::State*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<duckdb_re2::DFA::State*&,int>
                  ((_Hashtable<duckdb_re2::DFA::State*,std::pair<duckdb_re2::DFA::State*const,int>,std::allocator<std::pair<duckdb_re2::DFA::State*const,int>>,std::__detail::_Select1st,std::equal_to<duckdb_re2::DFA::State*>,std::hash<duckdb_re2::DFA::State*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&local_c0,&local_170,&local_164);
        if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_128._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<duckdb_re2::DFA::State*,std::allocator<duckdb_re2::DFA::State*>>::
          _M_push_back_aux<duckdb_re2::DFA::State*const&>
                    ((deque<duckdb_re2::DFA::State*,std::allocator<duckdb_re2::DFA::State*>> *)
                     &local_128,&local_170);
        }
        else {
          *local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = local_170;
          local_128._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_128._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
LAB_00484ec7:
        pmVar9 = std::__detail::
                 _Map_base<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_c0,&local_170);
        if (iVar14 == 0x100) {
          uVar10 = this->prog_->bytemap_range_;
        }
        else {
          uVar10 = (uint)this->prog_->bytemap_[iVar14];
        }
        local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)uVar10] = *pmVar9;
      }
    }
    if (*(long *)(local_d8 + 0x10) != 0) {
      piVar13 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((uVar11 & 1) != 0) {
        piVar13 = (int *)0x0;
      }
      if (state == (State *)&DAT_00000002) {
        bVar8 = true;
      }
      else {
        bVar8 = (bool)(*(byte *)((long)&state->flag_ + 1) & 1);
      }
      std::function<void_(const_int_*,_bool)>::operator()(local_d8,piVar13,bVar8);
    }
  } while (((uVar11 & 1) == 0) &&
          (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           local_128._M_impl.super__Deque_impl_data._M_start._M_cur));
LAB_00484f5d:
  iVar14 = (int)local_c0._M_element_count;
  if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  std::_Deque_base<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_>::
  ~_Deque_base(&local_128);
  std::
  _Hashtable<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_c0);
LAB_00484f99:
  RWLocker::~RWLocker(&local_d0);
  return iVar14;
}

Assistant:

int DFA::BuildAllStates(const Prog::DFAStateCallback& cb) {
  if (!ok())
    return 0;

  // Pick out start state for unanchored search
  // at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(StringPiece(), StringPiece(), &l);
  params.anchored = false;
  if (!AnalyzeSearch(&params) ||
      params.start == NULL ||
      params.start == DeadState)
    return 0;

  // Add start state to work queue.
  // Note that any State* that we handle here must point into the cache,
  // so we can simply depend on pointer-as-a-number hashing and equality.
  std::unordered_map<State*, int> m;
  std::deque<State*> q;
  m.emplace(params.start, static_cast<int>(m.size()));
  q.push_back(params.start);

  // Compute the input bytes needed to cover all of the next pointers.
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  std::vector<int> input(nnext);
  for (int c = 0; c < 256; c++) {
    int b = prog_->bytemap()[c];
    while (c < 256-1 && prog_->bytemap()[c+1] == b)
      c++;
    input[b] = c;
  }
  input[prog_->bytemap_range()] = kByteEndText;

  // Scratch space for the output.
  std::vector<int> output(nnext);

  // Flood to expand every state.
  bool oom = false;
  while (!q.empty()) {
    State* s = q.front();
    q.pop_front();
    for (int c : input) {
      State* ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        oom = true;
        break;
      }
      if (ns == DeadState) {
        output[ByteMap(c)] = -1;
        continue;
      }
      if (m.find(ns) == m.end()) {
        m.emplace(ns, static_cast<int>(m.size()));
        q.push_back(ns);
      }
      output[ByteMap(c)] = m[ns];
    }
    if (cb)
      cb(oom ? NULL : output.data(),
         s == FullMatchState || s->IsMatch());
    if (oom)
      break;
  }

  return static_cast<int>(m.size());
}